

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O3

vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_> *
wasm::StringifyProcessor::filterLocalSets
          (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           *__return_storage_ptr__,
          vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
          *substrings,vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/hash-stringify-walker.cpp:253:24)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/hash-stringify-walker.cpp:253:24)>
             ::_M_manager;
  filter(__return_storage_ptr__,substrings,exprs,
         (function<bool_(const_wasm::Expression_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SuffixTree::RepeatedSubstring> StringifyProcessor::filterLocalSets(
  const std::vector<SuffixTree::RepeatedSubstring>& substrings,
  const std::vector<Expression*>& exprs) {
  return StringifyProcessor::filter(
    substrings, exprs, [](const Expression* curr) {
      return curr->is<LocalSet>();
    });
}